

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

PropertyId * __thiscall Js::JavascriptRegExp::GetSpecialPropertyIdsInlined(JavascriptRegExp *this)

{
  bool bVar1;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  ScriptConfiguration *config;
  JavascriptRegExp *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
  if (bVar1) {
    bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
    if (bVar1) {
      this_local = (JavascriptRegExp *)specialPropertyIdsAll;
    }
    else {
      this_local = (JavascriptRegExp *)specialPropertyIdsWithoutDotAll;
    }
  }
  else {
    bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
    if (bVar1) {
      this_local = (JavascriptRegExp *)specialPropertyIdsWithoutUnicode;
    }
    else {
      this_local = (JavascriptRegExp *)specialPropertyIdsWithoutDotAllOrUnicode;
    }
  }
  return (PropertyId *)this_local;
}

Assistant:

inline PropertyId const * JavascriptRegExp::GetSpecialPropertyIdsInlined() const
    {
        const ScriptConfiguration* config = GetScriptContext()->GetConfig();
        if (config->IsES6UnicodeExtensionsEnabled())
        {
            if (config->IsES2018RegExDotAllEnabled())
            {
                return specialPropertyIdsAll;
            }
            else
            {
                return specialPropertyIdsWithoutDotAll;
            }
        }
        else
        {
            if (config->IsES2018RegExDotAllEnabled())
            {
                return specialPropertyIdsWithoutUnicode;
            }
            else
            {
                return specialPropertyIdsWithoutDotAllOrUnicode;
            }
        }
    }